

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::
TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::
add_sample(TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
           *this,double t,
          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *v)

{
  undefined1 local_48 [8];
  Sample s;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *v_local;
  double t_local;
  TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
  *this_local;
  
  s._32_8_ = v;
  Sample::Sample((Sample *)local_48);
  local_48 = (undefined1  [8])t;
  ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::operator=
            ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)&s,
             (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)s._32_8_);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample>>
  ::
  emplace_back<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample>>
              *)this,(Sample *)local_48);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_48);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }